

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alter_table_info.cpp
# Opt level: O1

void __thiscall duckdb::SetCommentInfo::SetCommentInfo(SetCommentInfo *this)

{
  LogicalType LStack_28;
  
  *(undefined2 *)&(this->super_AlterInfo).super_ParseInfo.info_type = 0x700;
  (this->super_AlterInfo).catalog._M_dataplus._M_p =
       (pointer)&(this->super_AlterInfo).catalog.field_2;
  (this->super_AlterInfo).catalog._M_string_length = 0;
  (this->super_AlterInfo).catalog.field_2._M_local_buf[0] = '\0';
  (this->super_AlterInfo).schema._M_dataplus._M_p = (pointer)&(this->super_AlterInfo).schema.field_2
  ;
  (this->super_AlterInfo).schema._M_string_length = 0;
  (this->super_AlterInfo).schema.field_2._M_local_buf[0] = '\0';
  (this->super_AlterInfo).name._M_dataplus._M_p = (pointer)&(this->super_AlterInfo).name.field_2;
  (this->super_AlterInfo).name._M_string_length = 0;
  (this->super_AlterInfo).name.field_2._M_local_buf[0] = '\0';
  (this->super_AlterInfo).super_ParseInfo._vptr_ParseInfo =
       (_func_int **)&PTR__SetCommentInfo_019b6940;
  LogicalType::LogicalType(&LStack_28,SQLNULL);
  Value::Value(&this->comment_value,&LStack_28);
  LogicalType::~LogicalType(&LStack_28);
  return;
}

Assistant:

SetCommentInfo::SetCommentInfo() : AlterInfo(AlterType::SET_COMMENT) {
}